

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mldsa_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_37bab4::MLDSATest_WycheproofSignTests65_Test::TestBody
          (MLDSATest_WycheproofSignTests65_Test *this)

{
  function<void_(FileTest_*)> local_30;
  MLDSATest_WycheproofSignTests65_Test *local_10;
  MLDSATest_WycheproofSignTests65_Test *this_local;
  
  local_10 = this;
  std::function<void(FileTest*)>::function<void(&)(FileTest*),void>
            ((function<void(FileTest*)> *)&local_30,
             MLDSAWycheproofSignTest<BCM_mldsa65_private_key,_&BCM_mldsa65_parse_private_key,_3309UL,_&BCM_mldsa65_sign_internal>
            );
  FileTestGTest("third_party/wycheproof_testvectors/mldsa_65_standard_sign_test.txt",&local_30);
  std::function<void_(FileTest_*)>::~function(&local_30);
  return;
}

Assistant:

TEST(MLDSATest, WycheproofSignTests65) {
  FileTestGTest(
      "third_party/wycheproof_testvectors/mldsa_65_standard_sign_test.txt",
      MLDSAWycheproofSignTest<
          BCM_mldsa65_private_key, BCM_mldsa65_parse_private_key,
          MLDSA65_SIGNATURE_BYTES, BCM_mldsa65_sign_internal>);
}